

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3lamb_io.c
# Opt level: O0

int s3lambcnt_write(char *fn,uint32 *lambda_cnt,uint32 n_lambda_cnt)

{
  int iVar1;
  int32 iVar2;
  uint32 local_38 [2];
  uint32 ignore;
  uint32 chksum;
  FILE *fp;
  uint32 *puStack_20;
  uint32 n_lambda_cnt_local;
  uint32 *lambda_cnt_local;
  char *fn_local;
  
  local_38[1] = 0;
  local_38[0] = 0;
  fp._4_4_ = n_lambda_cnt;
  puStack_20 = lambda_cnt;
  lambda_cnt_local = (uint32 *)fn;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  _ignore = s3open((char *)lambda_cnt_local,"wb",(uint32 *)0x0);
  if (_ignore == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    iVar1 = bio_fwrite_1d(puStack_20,4,fp._4_4_,_ignore,local_38 + 1);
    if (iVar1 < 0) {
      s3close(_ignore);
      fn_local._4_4_ = -1;
    }
    else {
      iVar2 = bio_fwrite(local_38 + 1,4,1,_ignore,0,local_38);
      if (iVar2 == 1) {
        s3close(_ignore);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3lamb_io.c"
                ,0xfa,"Wrote %s [%u array]\n",lambda_cnt_local,(ulong)fp._4_4_);
        fn_local._4_4_ = 0;
      }
      else {
        s3close(_ignore);
        fn_local._4_4_ = -1;
      }
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3lambcnt_write(const char *fn,
		const uint32 *lambda_cnt,
		uint32 n_lambda_cnt)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;

    s3clr_fattr();
    s3add_fattr("version", LAMBDACNT_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);


    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    if (bio_fwrite_1d((void *)lambda_cnt, sizeof(uint32), n_lambda_cnt, fp, &chksum) < 0) {
	s3close(fp);
	return S3_ERROR;
    }

    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);

	return S3_ERROR;
    }

    s3close(fp);

    E_INFO("Wrote %s [%u array]\n", fn, n_lambda_cnt);

    return S3_SUCCESS;
}